

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int luaL_callmeta(lua_State *L,int idx,char *field)

{
  TValue *pTVar1;
  int iVar2;
  TValue *pTVar3;
  TValue *top;
  char *field_local;
  int idx_local;
  lua_State *L_local;
  
  iVar2 = luaL_getmetafield(L,idx,field);
  if (iVar2 != 0) {
    pTVar1 = L->top;
    L->top = pTVar1 + -1;
    pTVar1->u64 = 0xffffffffffffffff;
    pTVar3 = index2adr(L,idx);
    pTVar1[1] = *pTVar3;
    L->top = pTVar1 + 2;
    lj_vm_call(L,pTVar1 + 1,2);
  }
  L_local._4_4_ = (uint)(iVar2 != 0);
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_callmeta(lua_State *L, int idx, const char *field)
{
  if (luaL_getmetafield(L, idx, field)) {
    TValue *top = L->top--;
    if (LJ_FR2) setnilV(top++);
    copyTV(L, top++, index2adr(L, idx));
    L->top = top;
    lj_vm_call(L, top-1, 1+1);
    return 1;
  }
  return 0;
}